

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_function_primitive_recompileAndOptimize
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  _Bool _Var2;
  sysbvm_tuple_t sVar3;
  sysbvm_context_t *context_00;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
    closure = argumentCount;
  }
  context_00 = (sysbvm_context_t *)*arguments;
  _Var2 = sysbvm_tuple_isFunction(context_00,closure);
  if (!_Var2) {
    sysbvm_error("Expected a function.");
    context_00 = (sysbvm_context_t *)*arguments;
  }
  if ((((context_00->heap).gcRootTableAllocator.lastChunk != (sysbvm_chunkedAllocatorChunk_t *)0x0)
      && (uVar1 = *(ulong *)&(context_00->heap).gcBlackColor, (uVar1 & 0xf) == 0 && uVar1 != 0)) &&
     (7 < *(uint *)(uVar1 + 0xc))) {
    sVar3 = sysbvm_interpreter_recompileAndOptimizeFunction(context,(sysbvm_function_t **)arguments)
    ;
    return sVar3;
  }
  return (sysbvm_tuple_t)context_00;
}

Assistant:

static sysbvm_tuple_t sysbvm_function_primitive_recompileAndOptimize(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    sysbvm_tuple_t *function = &arguments[0];
    if(!sysbvm_tuple_isFunction(context, *function)) sysbvm_error("Expected a function.");
    
    sysbvm_function_t **functionObject = (sysbvm_function_t**)function;
    if((*functionObject)->definition && sysbvm_array_getSize((*functionObject)->captureVector) > 0)
        return sysbvm_interpreter_recompileAndOptimizeFunction(context, functionObject);
    
    return *function;
}